

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

long __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,long a_nDefault,bool *a_pHasMultiple)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  int __base;
  char *pszSuffix;
  char szValue [64];
  char *local_60;
  char local_58 [64];
  
  pcVar1 = GetValue(this,a_pSection,a_pKey,(char *)0x0,a_pHasMultiple);
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    local_58[0x30] = '\0';
    local_58[0x31] = '\0';
    local_58[0x32] = '\0';
    local_58[0x33] = '\0';
    local_58[0x34] = '\0';
    local_58[0x35] = '\0';
    local_58[0x36] = '\0';
    local_58[0x37] = '\0';
    local_58[0x38] = '\0';
    local_58[0x39] = '\0';
    local_58[0x3a] = '\0';
    local_58[0x3b] = '\0';
    local_58[0x3c] = '\0';
    local_58[0x3d] = '\0';
    local_58[0x3e] = '\0';
    local_58[0x3f] = '\0';
    local_58[0x20] = '\0';
    local_58[0x21] = '\0';
    local_58[0x22] = '\0';
    local_58[0x23] = '\0';
    local_58[0x24] = '\0';
    local_58[0x25] = '\0';
    local_58[0x26] = '\0';
    local_58[0x27] = '\0';
    local_58[0x28] = '\0';
    local_58[0x29] = '\0';
    local_58[0x2a] = '\0';
    local_58[0x2b] = '\0';
    local_58[0x2c] = '\0';
    local_58[0x2d] = '\0';
    local_58[0x2e] = '\0';
    local_58[0x2f] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = '\0';
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    sVar2 = strlen(pcVar1);
    if (sVar2 + 1 < 0x41) {
      memcpy(local_58,pcVar1,sVar2 + 1);
      if ((local_58[0] == '0') && ((local_58[1] & 0xdfU) == 0x58)) {
        if (local_58[2] == '\0') {
          return a_nDefault;
        }
        pcVar1 = local_58 + 2;
        __base = 0x10;
      }
      else {
        pcVar1 = local_58;
        __base = 10;
      }
      local_60 = local_58;
      lVar3 = strtol(pcVar1,&local_60,__base);
      if (*local_60 == '\0') {
        a_nDefault = lVar3;
      }
    }
  }
  return a_nDefault;
}

Assistant:

long
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::GetLongValue(
    const SI_CHAR * a_pSection,
    const SI_CHAR * a_pKey,
    long            a_nDefault,
    bool *          a_pHasMultiple
    ) const
{
    // return the default if we don't have a value
    const SI_CHAR * pszValue = GetValue(a_pSection, a_pKey, NULL, a_pHasMultiple);
    if (!pszValue || !*pszValue) return a_nDefault;

    // convert to UTF-8/MBCS which for a numeric value will be the same as ASCII
    char szValue[64] = { 0 };
    SI_CONVERTER c(m_bStoreIsUtf8);
    if (!c.ConvertToStore(pszValue, szValue, sizeof(szValue))) {
        return a_nDefault;
    }

    // handle the value as hex if prefaced with "0x"
    long nValue = a_nDefault;
    char * pszSuffix = szValue;
    if (szValue[0] == '0' && (szValue[1] == 'x' || szValue[1] == 'X')) {
    	if (!szValue[2]) return a_nDefault;
        nValue = strtol(&szValue[2], &pszSuffix, 16);
    }
    else {
        nValue = strtol(szValue, &pszSuffix, 10);
    }

    // any invalid strings will return the default value
    if (*pszSuffix) {
        return a_nDefault;
    }

    return nValue;
}